

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall argstest::ArgumentParser::LongSeparator(ArgumentParser *this,string *longseparator_)

{
  string errorMessage;
  allocator local_39;
  string local_38 [32];
  
  if (longseparator_->_M_string_length == 0) {
    std::__cxx11::string::string(local_38,"longseparator can not be set to empty",&local_39);
    (this->super_Command).super_Group.super_Base.error = Usage;
    std::__cxx11::string::_M_assign
              ((string *)&(this->super_Command).super_Group.super_Base.errorMsg);
    std::__cxx11::string::~string(local_38);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->longseparator);
    if (this->allowJoinedLongValue == true) {
      std::__cxx11::string::string(local_38,(string *)longseparator_);
    }
    else {
      std::__cxx11::string::string(local_38," ",&local_39);
    }
    std::__cxx11::string::_M_assign((string *)&(this->helpParams).longSeparator);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void LongSeparator(const std::string &longseparator_)
            {
                if (longseparator_.empty())
                {
                    const std::string errorMessage("longseparator can not be set to empty");
#ifdef ARGS_NOEXCEPT
                    error = Error::Usage;
                    errorMsg = errorMessage;
#else
                    throw UsageError(errorMessage);
#endif
                } else
                {
                    this->longseparator = longseparator_;
                    this->helpParams.longSeparator = allowJoinedLongValue ? longseparator_ : " ";
                }
            }